

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

CharFormat testing::internal::PrintAsCharLiteralTo<wchar_t,wchar_t>(wchar_t c,ostream *os)

{
  CharFormat CVar1;
  long *plVar2;
  long *plVar3;
  int in_EDX;
  int value;
  char *pcVar4;
  long in_FS_OFFSET;
  string local_60;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  value = 0x1a8948;
  switch((String *)(ulong)(uint)c) {
  case (String *)0x0:
    pcVar4 = "\\0";
    break;
  case (String *)0x1:
  case (String *)0x2:
  case (String *)0x3:
  case (String *)0x4:
  case (String *)0x5:
  case (String *)0x6:
switchD_001a228d_caseD_1:
    if ((uint)(c + L'\xffffffe0') < 0x5f) {
      local_40 = (long *)CONCAT71(local_40._1_7_,(char)c);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_40,1);
      CVar1 = kAsIs;
    }
    else {
      String::FormatHexInt_abi_cxx11_(&local_60,(String *)(ulong)(uint)c,value);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1aa65b);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_30 = *plVar3;
        lStack_28 = plVar2[3];
        local_40 = &local_30;
      }
      else {
        local_30 = *plVar3;
        local_40 = (long *)*plVar2;
      }
      local_38 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_40,local_38);
      if (local_40 != &local_30) {
        operator_delete(local_40);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      CVar1 = kHexEscape;
    }
    goto LAB_001a2326;
  case (String *)0x7:
    pcVar4 = "\\a";
    break;
  case (String *)0x8:
    pcVar4 = "\\b";
    break;
  case (String *)0x9:
    pcVar4 = "\\t";
    break;
  case (String *)0xa:
    pcVar4 = "\\n";
    break;
  case (String *)0xb:
    pcVar4 = "\\v";
    break;
  case (String *)0xc:
    pcVar4 = "\\f";
    break;
  case (String *)0xd:
    pcVar4 = "\\r";
    break;
  default:
    if (c == L'\'') {
      pcVar4 = "\\\'";
    }
    else {
      value = in_EDX;
      if (c != L'\\') goto switchD_001a228d_caseD_1;
      pcVar4 = "\\\\";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,2);
  CVar1 = kSpecialEscape;
LAB_001a2326:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return CVar1;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
			switch (static_cast<wchar_t>(c)) {
			case L'\0':
				*os << "\\0";
				break;
			case L'\'':
				*os << "\\'";
				break;
			case L'\\':
				*os << "\\\\";
				break;
			case L'\a':
				*os << "\\a";
				break;
			case L'\b':
				*os << "\\b";
				break;
			case L'\f':
				*os << "\\f";
				break;
			case L'\n':
				*os << "\\n";
				break;
			case L'\r':
				*os << "\\r";
				break;
			case L'\t':
				*os << "\\t";
				break;
			case L'\v':
				*os << "\\v";
				break;
			default:
				if (IsPrintableAscii(c)) {
					*os << static_cast<char>(c);
					return kAsIs;
				}
				else {
					*os << "\\x" + String::FormatHexInt(static_cast<UnsignedChar>(c));
					return kHexEscape;
				}
			}
			return kSpecialEscape;
		}